

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptBlockData.cpp
# Opt level: O2

Value * __thiscall GlobOptBlockData::FindValue(GlobOptBlockData *this,Sym *sym)

{
  code *pcVar1;
  bool bVar2;
  SymKind SVar3;
  undefined4 *puVar4;
  StackSym *pSVar5;
  Value *pVVar6;
  
  if (this->symToValueMap == (GlobHashTable *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptBlockData.cpp"
                       ,0x508,"(this->symToValueMap)","this->symToValueMap");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  SVar3 = sym->m_kind;
  if (SVar3 == SymKindStack) {
    pSVar5 = Sym::AsStackSym(sym);
    if ((pSVar5->field_0x1a & 1) != 0) {
      pSVar5 = Sym::AsStackSym(sym);
      sym = &StackSym::GetVarEquivSym(pSVar5,this->globOpt->func)->super_Sym;
      SVar3 = (((StackSym *)sym)->super_Sym).m_kind;
      goto LAB_00461f06;
    }
    SVar3 = sym->m_kind;
  }
  if (SVar3 == SymKindProperty) {
    pVVar6 = FindPropertyValue(this,sym->m_id);
    return pVVar6;
  }
LAB_00461f06:
  if (SVar3 == SymKindStack) {
    pSVar5 = Sym::AsStackSym(sym);
    if ((pSVar5->field_0x1a & 4) != 0) {
      pVVar6 = SparseArray<Value>::Get
                         (this->globOpt->byteCodeConstantValueArray,
                          (((StackSym *)sym)->super_Sym).m_id);
      return pVVar6;
    }
  }
  pVVar6 = FindValueFromMapDirect(this,(((StackSym *)sym)->super_Sym).m_id);
  return pVVar6;
}

Assistant:

Value*
GlobOptBlockData::FindValue(Sym *sym)
{
    Assert(this->symToValueMap);

    if (sym->IsStackSym() && sym->AsStackSym()->IsTypeSpec())
    {
        sym = sym->AsStackSym()->GetVarEquivSym(this->globOpt->func);
    }
    else if (sym->IsPropertySym())
    {
        return this->FindPropertyValue(sym->m_id);
    }

    if (sym->IsStackSym() && sym->AsStackSym()->IsFromByteCodeConstantTable())
    {
        return this->globOpt->byteCodeConstantValueArray->Get(sym->m_id);
    }
    else
    {
        return FindValueFromMapDirect(sym->m_id);
    }
}